

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.cpp
# Opt level: O0

EqualIgnoreCaseConstraint * OpenMD::isEqualIgnoreCase(string *str)

{
  string *in_RSI;
  EqualIgnoreCaseConstraint *in_RDI;
  string *in_stack_00000188;
  EqualIgnoreCaseConstraint *in_stack_00000190;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint(in_stack_00000190,in_stack_00000188);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

EqualIgnoreCaseConstraint isEqualIgnoreCase(std::string str) {
    return EqualIgnoreCaseConstraint(str);
  }